

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_7c;
  float local_78;
  int local_74;
  int arc_segment_count;
  int circle_segment_count;
  float arc_length;
  ImVec2 local_54;
  byte local_4a;
  byte local_49;
  float local_48;
  _Bool a_emit_end;
  float fStack_44;
  _Bool a_emit_start;
  float a_max_segment_angle;
  float a_min_segment_angle;
  int a_mid_samples;
  int a_max_sample;
  int a_min_sample;
  float a_max_sample_f;
  float a_min_sample_f;
  float fStack_24;
  _Bool a_is_reverse;
  int num_segments_local;
  float a_max_local;
  float a_min_local;
  float radius_local;
  ImVec2 *center_local;
  ImDrawList *this_local;
  
  a_min_sample_f = (float)num_segments;
  fStack_24 = a_max;
  num_segments_local = (int)a_min;
  a_max_local = radius;
  _a_min_local = center;
  center_local = (ImVec2 *)this;
  if (0.0 < radius) {
    if (num_segments < 1) {
      if (this->_Data->ArcFastRadiusCutoff < radius) {
        fVar2 = ImAbs(a_max - a_min);
        iVar1 = _CalcCircleAutoSegmentCount(this,a_max_local);
        fVar5 = ceilf(((float)iVar1 * fVar2) / 6.2831855);
        iVar1 = ImMax<int>((int)fVar5,(int)(6.2831855 / fVar2));
        _PathArcToN(this,_a_min_local,a_max_local,(float)num_segments_local,fStack_24,iVar1);
      }
      else {
        a_max_sample_f._3_1_ = a_max < a_min;
        a_min_sample = (int)((a_min * 48.0) / 6.2831855);
        a_max_sample = (int)((a_max * 48.0) / 6.2831855);
        if ((bool)a_max_sample_f._3_1_) {
          fVar2 = ImFloorSigned((float)a_min_sample);
        }
        else {
          fVar2 = ceilf((float)a_min_sample);
        }
        local_74 = (int)fVar2;
        a_mid_samples = local_74;
        if ((a_max_sample_f._3_1_ & 1) == 0) {
          fVar2 = ImFloorSigned((float)a_max_sample);
        }
        else {
          fVar2 = ceilf((float)a_max_sample);
        }
        local_78 = (float)(int)fVar2;
        a_min_segment_angle = local_78;
        if ((a_max_sample_f._3_1_ & 1) == 0) {
          local_7c = (float)ImMax<int>((int)local_78 - a_mid_samples,0);
        }
        else {
          local_7c = (float)ImMax<int>(a_mid_samples - (int)local_78,0);
        }
        a_max_segment_angle = local_7c;
        fStack_44 = ((float)a_mid_samples * 3.1415927 * 2.0) / 48.0;
        local_48 = ((float)(int)a_min_segment_angle * 3.1415927 * 2.0) / 48.0;
        local_49 = fStack_44 - (float)num_segments_local != 0.0;
        local_4a = fStack_24 - local_48 != 0.0;
        ImVector<ImVec2>::reserve
                  (&this->_Path,
                   (this->_Path).Size + (int)local_7c + 1 + (uint)local_49 + (uint)local_4a);
        if ((local_49 & 1) != 0) {
          fVar2 = _a_min_local->x;
          fVar3 = cosf((float)num_segments_local);
          fVar3 = fVar3 * a_max_local;
          fVar5 = _a_min_local->y;
          fVar4 = sinf((float)num_segments_local);
          ImVec2::ImVec2(&local_54,fVar3 + fVar2,fVar4 * a_max_local + fVar5);
          ImVector<ImVec2>::push_back(&this->_Path,&local_54);
        }
        if (0 < (int)a_max_segment_angle) {
          _PathArcToFastEx(this,_a_min_local,a_max_local,a_mid_samples,(int)a_min_segment_angle,0);
        }
        if ((local_4a & 1) != 0) {
          fVar2 = _a_min_local->x;
          fVar3 = cosf(fStack_24);
          fVar3 = fVar3 * a_max_local;
          fVar5 = _a_min_local->y;
          fVar4 = sinf(fStack_24);
          ImVec2::ImVec2((ImVec2 *)&circle_segment_count,fVar3 + fVar2,fVar4 * a_max_local + fVar5);
          ImVector<ImVec2>::push_back(&this->_Path,(ImVec2 *)&circle_segment_count);
        }
      }
    }
    else {
      _PathArcToN(this,center,radius,a_min,a_max,num_segments);
    }
  }
  else {
    ImVector<ImVec2>::push_back(&this->_Path,center);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloorSigned(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloorSigned(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = (a_min_segment_angle - a_min) != 0.0f;
        const bool a_emit_end = (a_max - a_max_segment_angle) != 0.0f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}